

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

void __thiscall APowerMorph::EndEffect(APowerMorph *this)

{
  int iVar1;
  bool bVar2;
  int savedMorphTics;
  APowerMorph *this_local;
  
  APowerup::EndEffect(&this->super_APowerup);
  bVar2 = TObjPtr<AActor>::operator==(&(this->super_APowerup).super_AInventory.Owner,(AActor *)0x0);
  if (bVar2) {
    if (this->Player != (player_t *)0x0) {
      __assert_fail("Player == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_shared/a_artifacts.cpp"
                    ,0x79f,"virtual void APowerMorph::EndEffect()");
    }
  }
  else if ((this->Player != (player_t *)0x0) && (0 < this->Player->health)) {
    if ((this->bNoCallUndoMorph & 1U) == 0) {
      iVar1 = this->Player->morphTics;
      P_UndoPlayerMorph(this->Player,this->Player,0,(this->Player->MorphStyle & 0x2000U) != 0);
      if ((this->Player != (player_t *)0x0) && (this->Player->morphTics != 0)) {
        *(int *)&(this->super_APowerup).super_AInventory.field_0x4dc = this->Player->morphTics;
        this->Player->morphTics = iVar1;
        return;
      }
    }
    this->Player = (player_t *)0x0;
  }
  return;
}

Assistant:

void APowerMorph::EndEffect( )
{
	Super::EndEffect();

	// Abort if owner already destroyed
	if (Owner == NULL)
	{
		assert(Player == NULL);
		return;
	}
	
	// Abort if owner already unmorphed
	if (Player == NULL)
	{
		return;
	}

	// Abort if owner is dead; their Die() method will
	// take care of any required unmorphing on death.
	if (Player->health <= 0)
	{
		return;
	}

	// Unmorph if possible
	if (!bNoCallUndoMorph)
	{
		int savedMorphTics = Player->morphTics;
		P_UndoPlayerMorph (Player, Player, 0, !!(Player->MorphStyle & MORPH_UNDOALWAYS));

		// Abort if unmorph failed; in that case,
		// set the usual retry timer and return.
		if (Player != NULL && Player->morphTics)
		{
			// Transfer retry timeout
			// to the powerup's timer.
			EffectTics = Player->morphTics;
			// Reload negative morph tics;
			// use actual value; it may
			// be in use for animation.
			Player->morphTics = savedMorphTics;
			// Try again some time later
			return;
		}
	}
	// Unmorph suceeded
	Player = NULL;
}